

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::
InternalFeatureHelperTest_GetResolvedSourceFeatureExtensionEditedDefaults_Test::TestBody
          (InternalFeatureHelperTest_GetResolvedSourceFeatureExtensionEditedDefaults_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  Message *message;
  char *pcVar2;
  Descriptor *pDVar3;
  FileDescriptor *pFVar4;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  *extension;
  char *in_R9;
  AssertHelper local_300;
  Message local_2f8;
  EnumFeature local_2f0;
  EnumFeature local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_6;
  Message local_2d0;
  EnumFeature local_2c8;
  EnumFeature local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  Message local_2a8;
  EnumFeature local_2a0;
  EnumFeature local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_4;
  Message local_280;
  EnumFeature local_278;
  EnumFeature local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  TestFeatures *ext;
  Message local_1f0;
  char local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  FileDescriptor *local_1c0;
  FileDescriptor *file;
  Message local_1b0;
  FileDescriptor *local_1a8;
  char local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  FileDescriptor *local_178;
  char local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  string local_150;
  AssertHelper local_130;
  FeatureSetDefaults local_128;
  undefined1 local_f0 [8];
  string_view local_e8;
  Message local_d8 [3];
  FeatureSetDefaults local_c0;
  undefined1 local_88 [15];
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  ParseTextOrDie local_58;
  undefined1 local_48 [8];
  FeatureSetDefaults defaults;
  InternalFeatureHelperTest_GetResolvedSourceFeatureExtensionEditedDefaults_Test *this_local;
  
  defaults.field_0._32_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "\n    minimum_edition: EDITION_PROTO2\n    maximum_edition: EDITION_2024\n    defaults {\n      edition: EDITION_LEGACY\n      overridable_features {}\n      fixed_features {\n        field_presence: EXPLICIT\n        enum_type: CLOSED\n        repeated_field_encoding: EXPANDED\n        utf8_validation: NONE\n        message_encoding: LENGTH_PREFIXED\n        json_format: LEGACY_BEST_EFFORT\n        enforce_naming_style: STYLE_LEGACY\n        default_symbol_visibility: EXPORT_ALL\n      }\n    }\n    defaults {\n      edition: EDITION_2023\n      overridable_features {\n        field_presence: EXPLICIT\n        enum_type: OPEN\n        repeated_field_encoding: PACKED\n        utf8_validation: VERIFY\n        message_encoding: LENGTH_PREFIXED\n        json_format: ALLOW\n        [pb.test] {\n          file_feature: VALUE3\n          field_feature: VALUE15\n          enum_feature: VALUE14\n          source_feature: VALUE1\n        }\n      }\n      fixed_features {\n        enforce_naming_style: STYLE_LEGACY\n        default_symbol_visibility: EXPORT_ALL\n      }\n    }\n  "
            );
  ParseTextOrDie::ParseTextOrDie(&local_58,stack0xffffffffffffff98);
  ParseTextOrDie::operator_cast_to_FeatureSetDefaults((FeatureSetDefaults *)local_48,&local_58);
  FeatureSetDefaults::FeatureSetDefaults(&local_c0,(FeatureSetDefaults *)local_48);
  DescriptorPool::SetFeatureSetDefaults
            ((DescriptorPool *)local_88,
             (FeatureSetDefaults *)&(this->super_InternalFeatureHelperTest).pool_);
  local_79 = absl::lts_20250127::Status::ok((Status *)local_88);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status((Status *)local_88);
  FeatureSetDefaults::~FeatureSetDefaults(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    FeatureSetDefaults::FeatureSetDefaults(&local_128,(FeatureSetDefaults *)local_48);
    DescriptorPool::SetFeatureSetDefaults
              ((DescriptorPool *)local_f0,
               (FeatureSetDefaults *)&(this->super_InternalFeatureHelperTest).pool_);
    local_e8 = absl::lts_20250127::Status::message((Status *)local_f0);
    message = testing::Message::operator<<(local_d8,&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_78,
               (AssertionResult *)"pool_.SetFeatureSetDefaults(defaults).ok()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,message);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    absl::lts_20250127::Status::~Status((Status *)local_f0);
    FeatureSetDefaults::~FeatureSetDefaults(&local_128);
    testing::Message::~Message(local_d8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::NotNull();
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
              ();
    pDVar3 = DescriptorProto::descriptor();
    pFVar4 = Descriptor::file(pDVar3);
    local_178 = InternalFeatureHelperTest::BuildFile(&this->super_InternalFeatureHelperTest,pFVar4);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>::
    operator()(local_168,&local_169,
               (FileDescriptor **)"BuildFile(DescriptorProto::descriptor()->file())");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                 ,0x9b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_180);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::NotNull();
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
                ();
      pDVar3 = pb::TestMessage::descriptor();
      pFVar4 = Descriptor::file(pDVar3);
      local_1a8 = InternalFeatureHelperTest::BuildFile
                            (&this->super_InternalFeatureHelperTest,pFVar4);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_198,&local_199,
                   (FileDescriptor **)"BuildFile(pb::TestMessage::descriptor()->file())");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&file,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                   ,0x9c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&file,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&file);
        testing::Message::~Message(&local_1b0);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_2.message_,
                   "\n    edition = \"2023\";\n    package proto2_unittest;\n\n    import \"google/protobuf/unittest_features.proto\";\n\n    option features.(pb.test).file_feature = VALUE6;\n    option features.(pb.test).source_feature = VALUE5;\n  "
                  );
        local_1c0 = InternalFeatureHelperTest::BuildFile
                              (&this->super_InternalFeatureHelperTest,stack0xfffffffffffffe30);
        testing::NotNull();
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
                  ();
        extension = (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                     *)&local_1c0;
        testing::internal::
        PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
        ::operator()(local_1e0,&local_1e1,(FileDescriptor **)0x1eed29c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
        if (!bVar1) {
          testing::Message::Message(&local_1f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
          extension = (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                       *)0xa6;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ext,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                     ,0xa6,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&ext,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ext);
          testing::Message::~Message(&local_1f0);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          InternalFeatureHelperTest::
          GetResolvedSourceFeatureExtension<google::protobuf::FileDescriptor,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>
                    ((TestFeatures *)&gtest_ar_3.message_,(InternalFeatureHelperTest *)local_1c0,
                     (FileDescriptor *)pb::test,extension);
          this_00 = &gtest_ar_3.message_;
          local_274 = pb::TestFeatures::enum_feature((TestFeatures *)this_00);
          local_278 = VALUE14;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_270,"ext.enum_feature()","pb::EnumFeature::VALUE14",
                     &local_274,&local_278);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar1) {
            testing::Message::Message(&local_280);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                       ,0xaa,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_280);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
          local_29c = pb::TestFeatures::field_feature((TestFeatures *)this_00);
          local_2a0 = VALUE15;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_298,"ext.field_feature()","pb::EnumFeature::VALUE15",
                     &local_29c,&local_2a0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar1) {
            testing::Message::Message(&local_2a8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                       ,0xab,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_2a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
          local_2c4 = pb::TestFeatures::file_feature((TestFeatures *)this_00);
          local_2c8 = VALUE6;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_2c0,"ext.file_feature()","pb::EnumFeature::VALUE6",&local_2c4
                     ,&local_2c8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                       ,0xac,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
          local_2ec = pb::TestFeatures::source_feature((TestFeatures *)this_00);
          local_2f0 = VALUE5;
          testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
                    ((EqHelper *)local_2e8,"ext.source_feature()","pb::EnumFeature::VALUE5",
                     &local_2ec,&local_2f0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
          if (!bVar1) {
            testing::Message::Message(&local_2f8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_300,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                       ,0xad,pcVar2);
            testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
            testing::internal::AssertHelper::~AssertHelper(&local_300);
            testing::Message::~Message(&local_2f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
          pb::TestFeatures::~TestFeatures((TestFeatures *)&gtest_ar_3.message_);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_48);
  return;
}

Assistant:

TEST_F(InternalFeatureHelperTest,
       GetResolvedSourceFeatureExtensionEditedDefaults) {
  FeatureSetDefaults defaults = ParseTextOrDie(R"pb(
    minimum_edition: EDITION_PROTO2
    maximum_edition: EDITION_2024
    defaults {
      edition: EDITION_LEGACY
      overridable_features {}
      fixed_features {
        field_presence: EXPLICIT
        enum_type: CLOSED
        repeated_field_encoding: EXPANDED
        utf8_validation: NONE
        message_encoding: LENGTH_PREFIXED
        json_format: LEGACY_BEST_EFFORT
        enforce_naming_style: STYLE_LEGACY
        default_symbol_visibility: EXPORT_ALL
      }
    }
    defaults {
      edition: EDITION_2023
      overridable_features {
        field_presence: EXPLICIT
        enum_type: OPEN
        repeated_field_encoding: PACKED
        utf8_validation: VERIFY
        message_encoding: LENGTH_PREFIXED
        json_format: ALLOW
        [pb.test] {
          file_feature: VALUE3
          field_feature: VALUE15
          enum_feature: VALUE14
          source_feature: VALUE1
        }
      }
      fixed_features {
        enforce_naming_style: STYLE_LEGACY
        default_symbol_visibility: EXPORT_ALL
      }
    }
  )pb");
  ASSERT_OK(pool_.SetFeatureSetDefaults(defaults));

  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.(pb.test).file_feature = VALUE6;
    option features.(pb.test).source_feature = VALUE5;
  )schema");
  ASSERT_THAT(file, NotNull());
  const pb::TestFeatures& ext =
      GetResolvedSourceFeatureExtension(*file, pb::test);

  EXPECT_EQ(ext.enum_feature(), pb::EnumFeature::VALUE14);
  EXPECT_EQ(ext.field_feature(), pb::EnumFeature::VALUE15);
  EXPECT_EQ(ext.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext.source_feature(), pb::EnumFeature::VALUE5);
}